

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O3

void bench_wnaf_const(void *arg,int iters)

{
  int iVar1;
  int in_register_00000004;
  int extraout_var;
  uint uVar2;
  ulong unaff_RBX;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  secp256k1_scalar *a;
  secp256k1_scalar *psVar7;
  secp256k1_scalar *unaff_R12;
  uint uVar8;
  int iVar9;
  ulong unaff_R13;
  secp256k1_scalar *unaff_R14;
  uint64_t *unaff_R15;
  uint64_t *wnaf;
  secp256k1_sha256 sStack_f8;
  ulong uStack_88;
  secp256k1_scalar *psStack_80;
  uint64_t *puStack_78;
  int iStack_6c;
  ulong uStack_68;
  secp256k1_scalar *psStack_60;
  ulong uStack_58;
  secp256k1_scalar *psStack_50;
  uint64_t *puStack_48;
  code *pcStack_40;
  int local_34;
  
  a = (secp256k1_scalar *)arg;
  psStack_50 = unaff_R14;
  local_34 = in_register_00000004;
  if (iters < 1) {
LAB_0011cf97:
    uVar5 = 0;
  }
  else {
    unaff_R15 = (uint64_t *)((long)arg + 0x2d0);
    unaff_R12 = (secp256k1_scalar *)((long)arg + 0x20);
    unaff_R13 = 0;
    unaff_RBX = (ulong)(uint)iters;
    uVar5 = 0;
    local_34 = iters;
    do {
      pcStack_40 = (code *)0x11cf72;
      iVar1 = secp256k1_wnaf_const((int *)unaff_R15,(secp256k1_scalar *)arg,5,0x100);
      uVar5 = (ulong)(uint)((int)uVar5 + iVar1);
      pcStack_40 = (code *)0x11cf82;
      a = (secp256k1_scalar *)arg;
      iVar1 = secp256k1_scalar_add((secp256k1_scalar *)arg,(secp256k1_scalar *)arg,unaff_R12);
      uVar8 = (int)unaff_R13 + iVar1;
      unaff_R13 = (ulong)uVar8;
      uVar2 = (int)unaff_RBX - 1;
      unaff_RBX = (ulong)uVar2;
    } while (uVar2 != 0);
    psStack_50 = (secp256k1_scalar *)arg;
    iters = local_34;
    if ((int)uVar8 < 0) {
      pcStack_40 = (code *)0x11cf97;
      bench_wnaf_const_cold_2();
      goto LAB_0011cf97;
    }
  }
  uVar8 = iters * 0x100;
  uVar6 = (ulong)uVar8;
  uVar2 = (uint)uVar5;
  if (uVar2 == uVar8 || SBORROW4(uVar2,uVar8) != (int)(uVar2 + iters * -0x100) < 0) {
    return;
  }
  pcStack_40 = bench_ecmult_wnaf;
  bench_wnaf_const_cold_1();
  iVar1 = (int)uVar6;
  uVar3 = unaff_RBX;
  psVar7 = a;
  psStack_80 = psStack_50;
  wnaf = unaff_R15;
  uStack_68 = unaff_RBX;
  psStack_60 = unaff_R12;
  uStack_58 = unaff_R13;
  puStack_48 = unaff_R15;
  pcStack_40 = (code *)uVar5;
  iStack_6c = extraout_var;
  if (0 < iVar1) {
    wnaf = a[0x16].d + 2;
    iVar9 = 0;
    uVar3 = uVar6 & 0xffffffff;
    iVar4 = 0;
    iStack_6c = iVar1;
    do {
      puStack_78 = (uint64_t *)0x11cff1;
      iVar1 = secp256k1_ecmult_wnaf((int *)wnaf,0x100,a,5);
      iVar4 = iVar4 + iVar1;
      puStack_78 = (uint64_t *)0x11d001;
      psVar7 = a;
      iVar1 = secp256k1_scalar_add(a,a,a + 1);
      iVar9 = iVar9 + iVar1;
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0);
    psStack_80 = a;
    iVar1 = iStack_6c;
    if (-1 < iVar9) goto LAB_0011d018;
    puStack_78 = (uint64_t *)0x11d016;
    bench_ecmult_wnaf_cold_2();
  }
  iVar4 = 0;
LAB_0011d018:
  iVar9 = iVar1 * 0x100;
  if (iVar4 != iVar9 && SBORROW4(iVar4,iVar9) == iVar4 + iVar1 * -0x100 < 0) {
    puStack_78 = (uint64_t *)bench_sha256;
    bench_ecmult_wnaf_cold_1();
    if (0 < iVar9) {
      uStack_88 = uVar3;
      puStack_78 = wnaf;
      do {
        sStack_f8.s[0] = 0x6a09e667;
        sStack_f8.s[1] = 0xbb67ae85;
        sStack_f8.s[2] = 0x3c6ef372;
        sStack_f8.s[3] = 0xa54ff53a;
        sStack_f8.s[4] = 0x510e527f;
        sStack_f8.s[5] = 0x9b05688c;
        sStack_f8.s[6] = 0x1f83d9ab;
        sStack_f8.s[7] = 0x5be0cd19;
        sStack_f8.bytes = 0;
        secp256k1_sha256_write(&sStack_f8,(uchar *)(psVar7[0x14].d + 2),0x20);
        secp256k1_sha256_finalize(&sStack_f8,(uchar *)(psVar7[0x14].d + 2));
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    return;
  }
  return;
}

Assistant:

static void bench_wnaf_const(void* arg, int iters) {
    int i, bits = 0, overflow = 0;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        bits += secp256k1_wnaf_const(data->wnaf, &data->scalar[0], WINDOW_A, 256);
        overflow += secp256k1_scalar_add(&data->scalar[0], &data->scalar[0], &data->scalar[1]);
    }
    CHECK(overflow >= 0);
    CHECK(bits <= 256*iters);
}